

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gps_survey.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  exception *e;
  int n;
  bool rc;
  tsip gps;
  int rtn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff418;
  tsip *in_stack_fffffffffffff420;
  undefined8 in_stack_fffffffffffff460;
  undefined1 verbose;
  string *in_stack_fffffffffffff468;
  tsip *in_stack_fffffffffffff470;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff488;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff4a8;
  int survey_cnt;
  tsip *in_stack_fffffffffffff4b0;
  string local_b20 [32];
  byte local_b00;
  char **in_stack_fffffffffffff778;
  int in_stack_fffffffffffff780;
  
  survey_cnt = (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20);
  verbose = (undefined1)((ulong)in_stack_fffffffffffff460 >> 0x38);
  ::rc = 0;
  iVar1 = proc_args(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  if (0 < iVar1) {
    if (iVar1 != 2) {
      poVar2 = std::operator<<((ostream *)&std::cout," ***(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,") error encountered in parms***");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = 3;
    __cxa_throw(puVar3,&unsigned_long::typeinfo,0);
  }
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_fffffffffffff490,(char *)in_stack_fffffffffffff488);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  poVar2 = (ostream *)
           boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff490,in_stack_fffffffffffff488);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff420);
  std::__cxx11::string::string(local_b20,(string *)&gps_port_abi_cxx11_);
  tsip::tsip(in_stack_fffffffffffff470,in_stack_fffffffffffff468,(bool)verbose);
  std::__cxx11::string::~string(local_b20);
  if ((local_b00 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to open port - terminating run");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 99;
    __cxa_throw(puVar4,&int::typeinfo,0);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"setting survey_count to ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,::survey_cnt);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tsip::set_survey_params(in_stack_fffffffffffff4b0,survey_cnt);
  poVar2 = std::operator<<((ostream *)&std::cout,"starting self survey for ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,::survey_cnt);
  poVar2 = std::operator<<(poVar2," position readings");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tsip::start_self_survey(in_stack_fffffffffffff4b0);
  if (0 < wait_sec) {
    poVar2 = std::operator<<((ostream *)&std::cout,"waiting for ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,wait_sec);
    in_stack_fffffffffffff420 = (tsip *)std::operator<<(poVar2," seconds.");
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffff420,std::endl<char,std::char_traits<char>>);
    sleep(wait_sec);
    poVar2 = std::operator<<((ostream *)&std::cout,"OK...done!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  tsip::~tsip(in_stack_fffffffffffff420);
  return ::rc;
}

Assistant:

int main(int argc,char **argv) {
	rc = 0;
	
	try {
		int rtn = proc_args(argc,argv);
		if (rtn > EXIT_SUCCESS) {
			if (rtn != EXIT_HELP) {
				cout << " ***(" << rtn << ") error encountered in parms***" << endl << endl;
			}
			throw ERROR_IN_COMMAND_LINE;
		}
		
		//test_prt(argc,argv);

		//instantiate gps class
		cout << boost::format("gps is on port: %s") % gps_port<< endl;
		tsip gps(gps_port);
		
		if (!gps.port_status) {
			cout << "Unable to open port - terminating run" << endl;
			throw 99;
		}
		
		bool rc;
		//set the survey count
		cout << "setting survey_count to " << survey_cnt << endl;
		rc = gps.set_survey_params(survey_cnt);
		
		//start self survey
		cout << "starting self survey for " << survey_cnt << " position readings" << endl;
		rc = gps.start_self_survey();
		
		//wait for survey to finish
		if (wait_sec > 0) {
			cout << "waiting for " << wait_sec << " seconds." << endl;
			sleep(wait_sec);
			cout << "OK...done!" << endl;
		}
		
		rc = 0;
	} 
	catch(exception& e) {
		cerr << "Unhandled Exception reached the top of main: "
		     << e.what() << ", application will now exit" << endl;
		rc = ERROR_UNHANDLED_EXCEPTION;
		return ERROR_UNHANDLED_EXCEPTION;
	} 
	catch (int n) {
		rc = n;
	}
	catch(...) {
	}
	
	return rc;
}